

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

NodePtr __thiscall dh::analysis::multiplicative_expr(analysis *this)

{
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  TYPE TVar2;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  TreeNode *__tmp;
  analysis *in_RSI;
  NodePtr NVar5;
  NodePtr tmp_cur_ptr;
  NodePtr ret;
  NodePtr tmp_in_ptr;
  undefined1 local_e9;
  NodePtr local_e8;
  int local_cc;
  TreeNode *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c0;
  TreeNode *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  NodePtr local_a8;
  undefined1 local_98 [56];
  undefined1 local_60 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_c8 = (TreeNode *)0x0;
  _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  unary_expr((analysis *)&local_a8);
  TVar2 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  if (TVar2 == MULOP) {
    token::getVal_abi_cxx11_
              ((string *)local_98,
               (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    iVar3 = token::getLineno((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
    local_b8 = (TreeNode *)CONCAT44(local_b8._4_4_,iVar3);
    local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (TreeNode *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,std::__cxx11::string,int>
              (&local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (TreeNode **)&local_e8,(allocator<dh::TreeNode> *)&local_cc,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
               (int *)&local_b8);
    _Var4._M_pi = local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    this_00 = local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_c8 = this_00;
    _Stack_c0._M_pi = _Var4._M_pi;
    if ((undefined1 *)CONCAT44(local_98._4_4_,local_98._0_4_) != local_98 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_98._4_4_,local_98._0_4_));
    }
    token::getVal_abi_cxx11_
              ((string *)(local_60 + 0x10),
               (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    match(in_RSI,(string *)(local_60 + 0x10));
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._16_8_ != &local_40) {
      operator_delete((void *)local_60._16_8_);
    }
    local_98._0_4_ = 1;
    TreeNode::setNodeKind(this_00,(int *)local_98);
    local_98._0_4_ = 6;
    TreeNode::setKind(this_00,(int *)local_98);
    TreeNode::appendChild(this_00,&local_a8);
    if ((element_type *)_Var4._M_pi != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(((shared_ptr<dh::symTab> *)&(_Var4._M_pi)->_M_use_count)->
                 super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             *(int *)&(((shared_ptr<dh::symTab> *)&(_Var4._M_pi)->_M_use_count)->
                      super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1;
        UNLOCK();
      }
      else {
        *(int *)&(((shared_ptr<dh::symTab> *)&(_Var4._M_pi)->_M_use_count)->
                 super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             *(int *)&(((shared_ptr<dh::symTab> *)&(_Var4._M_pi)->_M_use_count)->
                      super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1;
      }
    }
    local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
    local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var4._M_pi;
    local_98._32_8_ = this;
    while( true ) {
      unary_expr((analysis *)local_98);
      _Var4._M_pi = local_a8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      local_a8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)CONCAT44(local_98._4_4_,local_98._0_4_);
      local_a8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_;
      if ((element_type *)_Var4._M_pi != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
      }
      TreeNode::appendChild
                (local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &local_a8);
      TVar2 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
      if (TVar2 != MULOP) break;
      token::getVal_abi_cxx11_
                ((string *)local_98,
                 (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      local_cc = token::getLineno((in_RSI->tmp).
                                  super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      local_b8 = (TreeNode *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,std::__cxx11::string,int>
                (&local_b0,&local_b8,(allocator<dh::TreeNode> *)&local_e9,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 &local_cc);
      if ((undefined1 *)CONCAT44(local_98._4_4_,local_98._0_4_) != local_98 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_98._4_4_,local_98._0_4_));
      }
      token::getVal_abi_cxx11_
                ((string *)(local_98 + 0x28),
                 (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      match(in_RSI,(string *)(local_98 + 0x28));
      if ((pointer)local_98._40_8_ != (pointer)local_60) {
        operator_delete((void *)local_98._40_8_);
      }
      local_98._0_4_ = 1;
      TreeNode::setNodeKind(local_b8,(int *)local_98);
      local_98._0_4_ = 6;
      TreeNode::setKind(local_b8,(int *)local_98);
      TreeNode::appendChild(local_b8,&local_e8);
      local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_b8;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &local_b0);
      if (local_b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0._M_pi);
      }
    }
    local_c8 = local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&_Stack_c0,
               &local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    _Var4._M_pi = extraout_RDX_00;
    if ((element_type *)
        local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      _Var4._M_pi = extraout_RDX_01;
    }
    this = (analysis *)local_98._32_8_;
    _Var1._M_pi = _Stack_c0._M_pi;
    _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(TreeNode **)local_98._32_8_ = local_c8;
    (((shared_ptr<dh::symTab> *)(local_98._32_8_ + 8))->
    super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)_Var1._M_pi
    ;
    local_c8 = (TreeNode *)0x0;
    if ((element_type *)
        local_a8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      _Var4._M_pi = extraout_RDX_02;
      if (_Stack_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_c0._M_pi);
        _Var4._M_pi = extraout_RDX_03;
      }
    }
  }
  else {
    *(element_type **)this =
         local_a8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_a8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    _Var4._M_pi = extraout_RDX;
  }
  NVar5.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi
  ;
  NVar5.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar5.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::multiplicative_expr()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in multiplicative_expr\n";
#endif
	NodePtr ret;
	NodePtr tmp_ptr = unary_expr();

	if ( tmp->getType() == TYPE::MULOP)
	{
		ret = ::std::make_shared<TreeNode>(tmp->getVal(),tmp->getLineno());
		match(tmp->getVal());

		ret->setNodeKind(NodeKind::ExprK);
		ret->setKind(ExprKind::MulK);
		ret->appendChild(tmp_ptr);

		NodePtr tmp_cur_ptr = ret;
		while (1)
		{
			tmp_ptr = unary_expr();
			tmp_cur_ptr->appendChild(tmp_ptr);

			if ( tmp->getType() == TYPE::MULOP)
			{
				NodePtr tmp_in_ptr = ::std::make_shared<TreeNode>(tmp->getVal(),tmp->getLineno());
				match(tmp->getVal());
				tmp_in_ptr->setNodeKind(NodeKind::ExprK);
				tmp_in_ptr->setKind(ExprKind::MulK);
				tmp_in_ptr->appendChild(tmp_cur_ptr);
				tmp_cur_ptr = tmp_in_ptr;
			} else 
			{
				ret = tmp_cur_ptr;
				break;
			}
		}

	} else 
	{
		return tmp_ptr;
	}

	return ret;
}